

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

xpath_ast_node * __thiscall
pugi::impl::anon_unknown_0::xpath_parser::parse_relative_location_path
          (xpath_parser *this,xpath_ast_node *set)

{
  lexeme_t lVar1;
  bool bVar2;
  xpath_ast_node *pxStack_28;
  lexeme_t l;
  xpath_ast_node *n;
  xpath_ast_node *set_local;
  xpath_parser *this_local;
  
  pxStack_28 = parse_step(this,set);
  while( true ) {
    if (pxStack_28 == (xpath_ast_node *)0x0) {
      return (xpath_ast_node *)0x0;
    }
    lVar1 = xpath_lexer::current(&this->_lexer);
    bVar2 = true;
    if (lVar1 != lex_slash) {
      lVar1 = xpath_lexer::current(&this->_lexer);
      bVar2 = lVar1 == lex_double_slash;
    }
    if (!bVar2) break;
    lVar1 = xpath_lexer::current(&this->_lexer);
    xpath_lexer::next(&this->_lexer);
    if ((lVar1 == lex_double_slash) &&
       (pxStack_28 = alloc_node(this,ast_step,pxStack_28,axis_descendant_or_self,nodetest_type_node,
                                (char_t *)0x0), pxStack_28 == (xpath_ast_node *)0x0)) {
      return (xpath_ast_node *)0x0;
    }
    pxStack_28 = parse_step(this,pxStack_28);
  }
  return pxStack_28;
}

Assistant:

xpath_ast_node* parse_relative_location_path(xpath_ast_node* set)
		{
			xpath_ast_node* n = parse_step(set);
			if (!n) return 0;

			while (_lexer.current() == lex_slash || _lexer.current() == lex_double_slash)
			{
				lexeme_t l = _lexer.current();
				_lexer.next();

				if (l == lex_double_slash)
				{
					n = alloc_node(ast_step, n, axis_descendant_or_self, nodetest_type_node, 0);
					if (!n) return 0;
				}

				n = parse_step(n);
				if (!n) return 0;
			}

			return n;
		}